

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.cpp
# Opt level: O3

void __thiscall
ot::commissioner::Job::Job
          (Job *this,Interpreter *aInterpreter,CommissionerAppPtr *aCommApp,Expression *aExpr,
          JobEvaluator *aEval,uint64_t aXpanId)

{
  this->mInterpreter = aInterpreter;
  this->mCommissioner = aCommApp;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mExpr,aExpr);
  std::
  function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&this->mEval,aEval);
  (this->mValue).mError.mCode = kNone;
  (this->mValue).mError.mMessage._M_dataplus._M_p = (pointer)&(this->mValue).mError.mMessage.field_2
  ;
  (this->mValue).mError.mMessage._M_string_length = 0;
  (this->mValue).mError.mMessage.field_2._M_local_buf[0] = '\0';
  (this->mValue).mData._M_dataplus._M_p = (pointer)&(this->mValue).mData.field_2;
  (this->mValue).mData._M_string_length = 0;
  (this->mValue).mData.field_2._M_local_buf[0] = '\0';
  (this->mJobThread)._M_id._M_thread = 0;
  this->mXpanId = aXpanId;
  return;
}

Assistant:

Job::Job(Interpreter              &aInterpreter,
         CommissionerAppPtr       &aCommApp,
         Interpreter::Expression   aExpr,
         Interpreter::JobEvaluator aEval,
         uint64_t                  aXpanId)
    : mInterpreter(aInterpreter)
    , mCommissioner(aCommApp)
    , mExpr(aExpr)
    , mEval(aEval)
    , mXpanId(aXpanId)
{
}